

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::TopLevelASVkImpl::TopLevelASVkImpl
          (TopLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,TopLevelASDesc *Desc)

{
  Uint32 *Args;
  TopLevelASDesc *Args_1;
  undefined1 *puVar1;
  VulkanPhysicalDevice *this_00;
  VulkanLogicalDevice *this_01;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
  *this_02;
  VkBuildAccelerationStructureFlagsKHR VVar7;
  uint uVar8;
  uint32_t MemoryTypeIndex;
  VkResult errorCode;
  VkDeviceSize VVar9;
  element_type *peVar10;
  VkDeviceAddress VVar11;
  VkDeviceSize VVar12;
  char *Args_2;
  ScratchBufferSizes SVar13;
  VkMemoryRequirements MemReqs;
  VkAccelerationStructureGeometryKHR vkGeometry;
  uint32_t MaxPrimitiveCount;
  VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo;
  char (*in_stack_fffffffffffffea8) [3];
  undefined1 local_148 [8];
  element_type *peStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  VkDeviceSize local_128;
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
  *local_118;
  VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *local_110;
  undefined1 local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  ulong local_a8;
  AccelStructWrapper local_a0;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_58._8_8_ = local_58._0_8_;
  TopLevelASBase<Diligent::EngineVkImplTraits>::TopLevelASBase
            (&this->super_TopLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVk,
             Desc,false);
  (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
  .super_ObjectBase<Diligent::ITopLevelASVk>.super_RefCountedObject<Diligent::ITopLevelASVk>.
  super_ITopLevelASVk.super_ITopLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_009217b0;
  local_118 = &this->m_VulkanTLAS;
  local_110 = &this->m_VulkanBuffer;
  this->m_DeviceAddress = 0;
  (this->m_VulkanTLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  *(undefined1 (*) [16])
   &(this->m_VulkanTLAS).m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount = (undefined1  [16])0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>)0x0;
  *(undefined1 (*) [16])&(this->m_VulkanBuffer).m_VkObject = (undefined1  [16])0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  this->m_MemoryAlignedOffset = 0;
  this_00 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_01 = (pRenderDeviceVk->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_a8 = (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
             .m_Desc.CompactedSize;
  if (local_a8 == 0) {
    local_b8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    local_d8 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    stack0xfffffffffffffefc = SUB1612((undefined1  [16])0x0,4);
    local_108._0_4_ = 0x3b9d13f6;
    local_f8._4_12_ = SUB1612((undefined1  [16])0x0,4);
    local_f8._M_allocated_capacity._0_4_ = 2;
    local_f8._8_4_ = 0x3b9d13f4;
    local_f8._12_4_ = 0;
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88._4_12_ = SUB1612((undefined1  [16])0x0,4);
    local_88._0_4_ = 0x3b9d13f0;
    VVar7 = BuildASFlagsToVkBuildAccelerationStructureFlags
                      ((this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                       .m_Desc.Flags);
    auVar3._4_8_ = local_78._8_8_;
    auVar3._0_4_ = VVar7;
    auVar3._12_4_ = 0;
    local_78 = auVar3 << 0x20;
    local_58._8_8_ = local_108;
    local_58._0_4_ = 1;
    uVar8 = (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
            .m_Desc.MaxInstanceCount;
    if ((pRenderDeviceVk->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
        MaxInstancesPerTLAS < uVar8) {
      Args = &(this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
              .m_Desc.MaxInstanceCount;
      FormatString<char[21],unsigned_int,char[25],unsigned_int,char[3]>
                ((string *)local_148,(Diligent *)"Max instance count (",(char (*) [21])Args,
                 (uint *)") exceeds device limit (",
                 (char (*) [25])
                 &(pRenderDeviceVk->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                  MaxInstancesPerTLAS,(uint *)0x75ce90,in_stack_fffffffffffffea8);
      DebugAssertionFailed
                ((Char *)local_148,"TopLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
                 ,0x40);
      if (local_148 != (undefined1  [8])&local_138) {
        operator_delete((void *)local_148,
                        CONCAT44(local_138._M_allocated_capacity._4_4_,
                                 local_138._M_allocated_capacity._0_4_) + 1);
      }
      uVar8 = *Args;
    }
    local_138._M_allocated_capacity._0_4_ = 0;
    local_138._M_allocated_capacity._4_4_ = 0;
    local_138._8_8_ = 0;
    local_128 = 0;
    stack0xfffffffffffffebc = SUB1612((undefined1  [16])0x0,4);
    local_148._0_4_ = 0x3b9d1404;
    local_a0.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             CONCAT44(local_a0.m_pLogicalDevice.
                      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._4_4_,uVar8);
    VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureBuildSizes
              (this_01,(VkAccelerationStructureBuildGeometryInfoKHR *)local_88,(uint32_t *)&local_a0
               ,(VkAccelerationStructureBuildSizesInfoKHR *)local_148);
    local_a8 = CONCAT44(local_138._M_allocated_capacity._4_4_,local_138._M_allocated_capacity._0_4_)
    ;
    SVar13.Update._0_4_ = (int)local_138._8_8_;
    SVar13.Build = local_128;
    SVar13.Update._4_4_ = (int)((ulong)local_138._8_8_ >> 0x20);
    (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize = SVar13;
  }
  Args_1 = &(this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
            .m_Desc;
  local_88._4_12_ = SUB1612((undefined1  [16])0x0,4);
  local_88._0_4_ = 0xc;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_a8;
  local_78 = auVar4 << 0x40;
  local_68._4_12_ = SUB1612((undefined1  [16])0x0,4);
  local_68._0_4_ = 0x120000;
  local_68._8_8_ = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_58._8_8_;
  local_58 = auVar5 << 0x40;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)local_108,this_01,(VkBufferCreateInfo *)local_88,
             (Args_1->super_DeviceObjectAttribs).Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(local_110,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_108);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_108)
  ;
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            ((VkMemoryRequirements *)local_148,this_01,(this->m_VulkanBuffer).m_VkObject);
  MemoryTypeIndex =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                 (this_00,local_138._M_allocated_capacity._0_4_,1);
  if (((ulong)peStack_140 ^ (long)peStack_140 - 1U) <= (long)peStack_140 - 1U) {
    FormatString<char[29]>((string *)local_108,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)local_108,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x5b);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,(ulong)(local_f8._M_allocated_capacity + 1));
    }
  }
  Args_2 = (char *)(ulong)MemoryTypeIndex;
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)local_108,pRenderDeviceVk,(VkDeviceSize)local_148,
             (VkDeviceSize)peStack_140,MemoryTypeIndex,2);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)local_108;
  (this->m_MemoryAllocation).UnalignedOffset = (VkDeviceSize)_Stack_100._M_pi;
  (this->m_MemoryAllocation).Size = local_f8._M_allocated_capacity;
  local_108 = (undefined1  [8])0x0;
  _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_f8._8_8_;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )(auVar2 << 0x40);
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)local_108);
  if ((this->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    Args_2 = "Failed to allocate memory for TLAS \'";
    LogError<true,char[37],char_const*,char[3]>
              (false,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x5e,(char (*) [37])"Failed to allocate memory for TLAS \'",(char **)Args_1,
               (char (*) [3])"\'.");
  }
  VVar12 = (this->m_MemoryAllocation).UnalignedOffset;
  local_a0.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peStack_140;
  puVar1 = (undefined1 *)
           ((long)&peStack_140[-1].m_SupportedAccessMask.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  VVar9 = VVar12;
  if ((undefined1 *)((ulong)peStack_140 ^ (ulong)puVar1) <= puVar1) {
    FormatString<char[12],unsigned_long,char[23]>
              ((string *)local_108,(Diligent *)"Alignment (",(char (*) [12])&local_a0,
               (unsigned_long *)") must be a power of 2",(char (*) [23])Args_2);
    DebugAssertionFailed
              ((Char *)local_108,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,(ulong)(local_f8._M_allocated_capacity + 1));
    }
    VVar9 = (this->m_MemoryAllocation).UnalignedOffset;
  }
  this_02 = local_118;
  VVar12 = -(long)local_a0.m_pLogicalDevice.
                  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr &
           (long)local_a0.m_pLogicalDevice.
                 super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + (VVar12 - 1);
  this->m_MemoryAlignedOffset = VVar12;
  if ((pointer)(this->m_MemoryAllocation).Size < (pointer)((long)local_148 + (VVar12 - VVar9))) {
    FormatString<char[39]>
              ((string *)local_108,(char (*) [39])"Size of memory allocation is too small");
    DebugAssertionFailed
              ((Char *)local_108,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x61);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,(ulong)(local_f8._M_allocated_capacity + 1));
    }
    VVar12 = this->m_MemoryAlignedOffset;
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_01,(this->m_VulkanBuffer).m_VkObject,
                         (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject,VVar12);
  if (errorCode != VK_SUCCESS) {
    peVar10 = (element_type *)VulkanUtilities::VkResultToString(errorCode);
    local_108 = (undefined1  [8])peVar10;
    LogError<true,char[29],char[17],char_const*>
              (false,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,100,(char (*) [29])"Failed to bind buffer memory",(char (*) [17])"\nVK Error Code: "
               ,(char **)local_108);
  }
  local_d8 = (undefined1  [16])0x0;
  stack0xfffffffffffffefc = SUB1612((undefined1  [16])0x0,4);
  local_108._0_4_ = 0x3b9d1401;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->m_VulkanBuffer).m_VkObject;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )(auVar6 << 0x40);
  local_e8._8_8_ = 0;
  local_e8._0_8_ = local_a8;
  local_e8 = local_e8 << 0x40;
  VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
            (&local_a0,this_01,(VkAccelerationStructureCreateInfoKHR *)local_108,
             (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  operator=(this_02,&local_a0);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper(&local_a0);
  VVar11 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
                     (this_01,(this->m_VulkanTLAS).m_VkObject);
  this->m_DeviceAddress = VVar11;
  (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_BUILD_AS_READ;
  return;
}

Assistant:

TopLevelASVkImpl::TopLevelASVkImpl(IReferenceCounters*   pRefCounters,
                                   RenderDeviceVkImpl*   pRenderDeviceVk,
                                   const TopLevelASDesc& Desc) :
    TTopLevelASBase{pRefCounters, pRenderDeviceVk, Desc}
{
    const auto& LogicalDevice   = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    const auto& RTProps         = pRenderDeviceVk->GetAdapterInfo().RayTracing;
    auto        AccelStructSize = m_Desc.CompactedSize;

    if (AccelStructSize == 0)
    {
        VkAccelerationStructureGeometryKHR vkGeometry{};
        vkGeometry.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        vkGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;

        VkAccelerationStructureGeometryInstancesDataKHR& vkInstances{vkGeometry.geometry.instances};
        vkInstances.sType           = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_INSTANCES_DATA_KHR;
        vkInstances.arrayOfPointers = VK_FALSE;

        VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo{};
        vkBuildInfo.sType         = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
        vkBuildInfo.flags         = BuildASFlagsToVkBuildAccelerationStructureFlags(m_Desc.Flags);
        vkBuildInfo.type          = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
        vkBuildInfo.pGeometries   = &vkGeometry;
        vkBuildInfo.geometryCount = 1;

        DEV_CHECK_ERR(m_Desc.MaxInstanceCount <= RTProps.MaxInstancesPerTLAS,
                      "Max instance count (", m_Desc.MaxInstanceCount, ") exceeds device limit (", RTProps.MaxInstancesPerTLAS, ").");

        VkAccelerationStructureBuildSizesInfoKHR vkSizeInfo{};
        vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;

        const uint32_t MaxPrimitiveCount = m_Desc.MaxInstanceCount;
        LogicalDevice.GetAccelerationStructureBuildSizes(vkBuildInfo, &MaxPrimitiveCount, vkSizeInfo);

        AccelStructSize      = vkSizeInfo.accelerationStructureSize;
        m_ScratchSize.Build  = vkSizeInfo.buildScratchSize;
        m_ScratchSize.Update = vkSizeInfo.updateScratchSize;
    }

    VkBufferCreateInfo vkBuffCI{};
    vkBuffCI.sType                 = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    vkBuffCI.flags                 = 0;
    vkBuffCI.size                  = AccelStructSize;
    vkBuffCI.usage                 = VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_STORAGE_BIT_KHR | VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
    vkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    vkBuffCI.queueFamilyIndexCount = 0;
    vkBuffCI.pQueueFamilyIndices   = nullptr;

    m_VulkanBuffer = LogicalDevice.CreateBuffer(vkBuffCI, m_Desc.Name);

    VkMemoryRequirements MemReqs         = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);
    uint32_t             MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    VERIFY(IsPowerOfTwo(MemReqs.alignment), "Alignment is not power of 2!");
    m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for TLAS '", m_Desc.Name, "'.");

    m_MemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, MemReqs.alignment);
    VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_MemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
    auto Memory = m_MemoryAllocation.Page->GetVkMemory();
    auto err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_MemoryAlignedOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    VkAccelerationStructureCreateInfoKHR vkAccelStrCI{};
    vkAccelStrCI.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
    vkAccelStrCI.createFlags = 0;
    vkAccelStrCI.buffer      = m_VulkanBuffer;
    vkAccelStrCI.offset      = 0;
    vkAccelStrCI.size        = AccelStructSize;
    vkAccelStrCI.type        = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;

    m_VulkanTLAS = LogicalDevice.CreateAccelStruct(vkAccelStrCI, m_Desc.Name);

    m_DeviceAddress = LogicalDevice.GetAccelerationStructureDeviceAddress(m_VulkanTLAS);

    SetState(RESOURCE_STATE_BUILD_AS_READ);
}